

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema_const*&,capnp::_::RawSchema_const*&>&,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> *params,
          char (*params_1) [53],unsigned_long *params_2,Reader *params_3,Reader *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  char (*params_00) [53];
  unsigned_long *params_01;
  Reader *params_02;
  Reader *params_03;
  long lVar4;
  String argValues [5];
  long *plVar5;
  undefined8 uVar6;
  long local_c8 [3];
  String local_b0;
  String local_98;
  String local_80;
  String local_68;
  long local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_48,params,CONCAT44(in_register_00000014,line));
  local_c8[0] = local_48;
  local_c8[1] = local_40;
  local_c8[2] = uStack_38;
  str<char_const(&)[53]>(&local_b0,(kj *)params_1,params_00);
  str<unsigned_long_const&>(&local_98,(kj *)params_2,params_01);
  str<capnp::Text::Reader&>(&local_80,(kj *)params_3,params_02);
  str<capnp::Text::Reader&>(&local_68,(kj *)params_4,params_03);
  plVar5 = local_c8;
  uVar6 = 5;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)local_c8 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_c8 + lVar4 + 8);
      *(undefined8 *)((long)local_c8 + lVar4) = 0;
      *(undefined8 *)((long)local_c8 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_c8 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}